

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_hostop(compiler_state_t *cstate,bpf_u_int32 addr,bpf_u_int32 mask,int dir,int proto,
                  u_int src_off,u_int dst_off)

{
  block *pbVar1;
  block *pbVar2;
  u_int local_44;
  u_int offset;
  block *b1;
  block *b0;
  u_int src_off_local;
  int proto_local;
  int dir_local;
  bpf_u_int32 mask_local;
  bpf_u_int32 addr_local;
  compiler_state_t *cstate_local;
  
  switch(dir) {
  case 0:
  case 3:
    pbVar1 = gen_hostop(cstate,addr,mask,1,proto,src_off,dst_off);
    pbVar2 = gen_hostop(cstate,addr,mask,2,proto,src_off,dst_off);
    gen_or(pbVar1,pbVar2);
    return pbVar2;
  case 1:
    local_44 = src_off;
    break;
  case 2:
    local_44 = dst_off;
    break;
  case 4:
    pbVar1 = gen_hostop(cstate,addr,mask,1,proto,src_off,dst_off);
    pbVar2 = gen_hostop(cstate,addr,mask,2,proto,src_off,dst_off);
    gen_and(pbVar1,pbVar2);
    return pbVar2;
  default:
    abort();
  }
  pbVar1 = gen_linktype(cstate,proto);
  pbVar2 = gen_mcmp(cstate,OR_LINKPL,local_44,0,addr,mask);
  gen_and(pbVar1,pbVar2);
  return pbVar2;
}

Assistant:

static struct block *
gen_hostop(compiler_state_t *cstate, bpf_u_int32 addr, bpf_u_int32 mask,
    int dir, int proto, u_int src_off, u_int dst_off)
{
	struct block *b0, *b1;
	u_int offset;

	switch (dir) {

	case Q_SRC:
		offset = src_off;
		break;

	case Q_DST:
		offset = dst_off;
		break;

	case Q_AND:
		b0 = gen_hostop(cstate, addr, mask, Q_SRC, proto, src_off, dst_off);
		b1 = gen_hostop(cstate, addr, mask, Q_DST, proto, src_off, dst_off);
		gen_and(b0, b1);
		return b1;

	case Q_OR:
	case Q_DEFAULT:
		b0 = gen_hostop(cstate, addr, mask, Q_SRC, proto, src_off, dst_off);
		b1 = gen_hostop(cstate, addr, mask, Q_DST, proto, src_off, dst_off);
		gen_or(b0, b1);
		return b1;

	default:
		abort();
	}
	b0 = gen_linktype(cstate, proto);
	b1 = gen_mcmp(cstate, OR_LINKPL, offset, BPF_W, (bpf_int32)addr, mask);
	gen_and(b0, b1);
	return b1;
}